

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MipsDisassembler.c
# Opt level: O1

DecodeStatus readInstruction32(uchar *code,uint32_t *insn,_Bool isBigEndian,_Bool isMicroMips)

{
  DecodeStatus DVar1;
  undefined3 in_register_00000011;
  
  if (CONCAT31(in_register_00000011,isBigEndian) == 0) {
    if (isMicroMips) {
      DVar1 = (DecodeStatus)CONCAT12(*code,*(undefined2 *)(code + 2));
      code = code + 1;
    }
    else {
      DVar1 = (DecodeStatus)*(uint3 *)code;
      code = code + 3;
    }
  }
  else {
    DVar1 = (DecodeStatus)CONCAT12(code[1],*(ushort *)(code + 2) << 8 | *(ushort *)(code + 2) >> 8);
  }
  *insn = (uint)*code << 0x18 | DVar1;
  return DVar1;
}

Assistant:

static DecodeStatus readInstruction32(unsigned char *code, uint32_t *insn, bool isBigEndian, bool isMicroMips)
{
	// We want to read exactly 4 Bytes of data.
	if (isBigEndian) {
		// Encoded as a big-endian 32-bit word in the stream.
		*insn = (code[3] <<  0) |
			(code[2] <<  8) |
			(code[1] << 16) |
			(code[0] << 24);
	} else {
		// Encoded as a small-endian 32-bit word in the stream.
		// Little-endian byte ordering:
		//   mips32r2:   4 | 3 | 2 | 1
		//   microMIPS:  2 | 1 | 4 | 3
		if (isMicroMips) {
			*insn = (code[2] <<  0) |
				(code[3] <<  8) |
				(code[0] << 16) |
				(code[1] << 24);
		} else {
			*insn = (code[0] <<  0) |
				(code[1] <<  8) |
				(code[2] << 16) |
				(code[3] << 24);
		}
	}

	return MCDisassembler_Success;
}